

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O0

int tcv_destroy(tcv_t *tcv)

{
  _Bool _Var1;
  int ret;
  tcv_t *tcv_local;
  
  _Var1 = tcv_check_and_lock_ok(tcv);
  if (_Var1) {
    if (tcv->data != (void *)0x0) {
      free(tcv->data);
      tcv->data = (void *)0x0;
      tcv->created = false;
    }
    tcv_unlock(tcv);
    pthread_mutex_destroy((pthread_mutex_t *)&tcv->lock);
    free(tcv);
    tcv_local._4_4_ = 0;
  }
  else {
    tcv_local._4_4_ = -4;
  }
  return tcv_local._4_4_;
}

Assistant:

int tcv_destroy(tcv_t *tcv)
{
	int ret = 0;

	if (!tcv_check_and_lock_ok(tcv))
		return TCV_ERR_INVALID_ARG;

	if (tcv->data) {
		free(tcv->data);
		tcv->data = NULL;
		tcv->created = false;
	}
	tcv_unlock(tcv);
	pthread_mutex_destroy(&tcv->lock);
	free(tcv);

	return ret;
}